

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapTest.cpp
# Opt level: O0

void SubTest(void)

{
  ostream *poVar1;
  bool *a2;
  bool *a1;
  long x;
  undefined1 auStack_8 [6];
  bool b;
  bool a;
  
  x._7_1_ = 1;
  x._6_1_ = 1;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(void *)((long)&x + 7));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,auStack_8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(void *)((long)&x + 7));
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,auStack_8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void SubTest() {
    bool a = 3;
    bool b = 4;
    auto x = &a - &b;
    cout << x << endl;

    cout << &a << endl;
    cout << (&a + 1) << endl;

    auto a1 = &a;
    auto a2 = (&a + 1);
    cout << a1 << ' ' << a2 << endl;
}